

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_X86.cpp
# Opt level: O0

void __thiscall ExecutorX86::Resume(ExecutorX86 *this)

{
  ExecutorX86 *this_local;
  
  (this->vmState).callStackTop = (this->vmState).callStackBase + this->execErrorFinalReturnDepth;
  this->codeRunning = true;
  this->callContinue = true;
  this->execErrorMessage = (char *)0x0;
  (this->execErrorObject).typeID = 0;
  (this->execErrorObject).ptr = (char *)0x0;
  return;
}

Assistant:

void ExecutorX86::Resume()
{
	vmState.callStackTop = vmState.callStackBase + execErrorFinalReturnDepth;

	codeRunning = true;

	callContinue = true;

	execErrorMessage = NULL;

	execErrorObject.typeID = 0;
	execErrorObject.ptr = NULL;
}